

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

idx_t __thiscall duckdb::RadixHTConfig::MaximumSinkRadixBits(RadixHTConfig *this)

{
  uint64_t n_partitions;
  idx_t iVar1;
  
  if (this->number_of_threads < 3) {
    n_partitions = NextPowerOfTwo(this->number_of_threads);
    iVar1 = RadixPartitioning::RadixBitsOfPowerOfTwo(n_partitions);
    if (3 < iVar1) {
      iVar1 = 4;
    }
    return iVar1;
  }
  if (0x3f < this->row_width) {
    return 6;
  }
  return (ulong)(this->row_width < 0x20) + 7;
}

Assistant:

idx_t RadixHTConfig::MaximumSinkRadixBits() const {
	if (number_of_threads <= GROW_STRATEGY_THREAD_THRESHOLD) {
		return InitialSinkRadixBits(); // Don't repartition unless we go external
	}
	// If rows are very wide we have to reduce the number of partitions, otherwise cache misses get out of hand
	if (row_width >= ROW_WIDTH_THRESHOLD_TWO) {
		return MAXIMUM_FINAL_SINK_RADIX_BITS - 2;
	}
	if (row_width >= ROW_WIDTH_THRESHOLD_ONE) {
		return MAXIMUM_FINAL_SINK_RADIX_BITS - 1;
	}
	return MAXIMUM_FINAL_SINK_RADIX_BITS;
}